

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O1

void __thiscall ON_SerialNumberMap::GarbageCollectHelper(ON_SerialNumberMap *this)

{
  size_t sz;
  MAP_VALUE *pMVar1;
  ON_SerialNumberMapPrivate *pOVar2;
  ON_SN_BLOCK *pOVar3;
  ulong uVar4;
  SN_ELEMENT *pSVar5;
  anon_union_8_5_72d3814f_for_m_u aVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  uint uVar13;
  ulong uVar14;
  ON_SN_BLOCK *pOVar15;
  long lVar16;
  ON__UINT64 OVar17;
  ON_SN_BLOCK **ppOVar18;
  SN_ELEMENT *pSVar19;
  ON_SN_BLOCK *pOVar20;
  undefined8 *puVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  ON__UINT64 OVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  bool bVar29;
  
  if (this->m_bHashTableIsValid != '\0') {
    this->m_bHashTableIsValid = '\0';
  }
  pOVar15 = this->m_sn_block0;
  uVar27 = (ulong)pOVar15->m_purged;
  if (uVar27 == 0) {
    if ((pOVar15->m_sorted == 0) &&
       (ON_SN_BLOCK::SortBlockHelper(pOVar15), this->m_snblk_list_count == 0)) {
      pOVar2 = this->m_private;
      uVar27 = this->m_sn_block0->m_sn1;
      pOVar2->m_maxsn = uVar27;
      if (uVar27 < 0xffffffff) {
        pOVar2->m_lower_maxsn = uVar27;
      }
    }
  }
  else {
    this->m_sn_count = this->m_sn_count - uVar27;
    this->m_sn_purged = this->m_sn_purged - uVar27;
    ON_SN_BLOCK::CullBlockHelper(pOVar15);
    pOVar15 = this->m_sn_block0;
    if (pOVar15->m_sorted == 0) {
      ON_SN_BLOCK::SortBlockHelper(pOVar15);
    }
    if (this->m_snblk_list_count == 0) {
      pOVar2 = this->m_private;
      uVar27 = this->m_sn_block0->m_sn1;
      pOVar2->m_maxsn = uVar27;
      if (uVar27 < 0xffffffff) {
        pOVar2->m_lower_maxsn = uVar27;
      }
    }
    if (this->m_sn_block0->m_count < 0x1c00) {
      return;
    }
  }
  this->m_sn_purged = 0;
  OVar25 = this->m_snblk_list_count;
  this->m_sn_count = (ulong)this->m_sn_block0->m_count;
  while (OVar25 != 0) {
    pOVar15 = this->m_snblk_list[OVar25 - 1];
    if (pOVar15->m_purged != 0) {
      ON_SN_BLOCK::CullBlockHelper(pOVar15);
    }
    OVar25 = OVar25 - 1;
    this->m_sn_count = this->m_sn_count + (ulong)this->m_snblk_list[OVar25]->m_count;
  }
  uVar27 = this->m_snblk_list_count;
  if (uVar27 != 0) {
    uVar14 = 0;
    pOVar15 = (ON_SN_BLOCK *)this->m_snblk_list;
    do {
      uVar26 = uVar14;
      if (**(int **)pOVar15 == 0) goto LAB_004d6783;
      uVar14 = uVar14 + 1;
      pOVar15 = (ON_SN_BLOCK *)&pOVar15->m_sorted;
    } while (uVar27 != uVar14);
  }
  goto LAB_004d67cc;
  while (lVar16 = uVar26 * 8, uVar26 = uVar26 + 1,
        **(int **)(((ON_SN_BLOCK *)this->m_snblk_list)->m_sn[0].m_id.Data4 + lVar16 + -0x20) == 0) {
LAB_004d6783:
    if (uVar27 <= uVar26 + 1) goto LAB_004d67a9;
  }
  ON_qsort(pOVar15,uVar27 - uVar14,8,ON_SN_BLOCK::CompareMaxSN);
LAB_004d67a9:
  OVar25 = this->m_snblk_list_count;
  if (OVar25 != 0) {
    do {
      OVar25 = OVar25 - 1;
      if (this->m_snblk_list[OVar25]->m_count != 0) break;
      this->m_snblk_list_count = OVar25;
    } while (OVar25 != 0);
  }
LAB_004d67cc:
  if ((this->m_snblk_list_count != 0) &&
     (this->m_sn_block0->m_sn0 < this->m_snblk_list[this->m_snblk_list_count - 1]->m_sn1)) {
    pOVar15 = (ON_SN_BLOCK *)onmalloc(0xe0000);
    uVar27 = this->m_snblk_list_count;
    if (uVar27 != 0) {
      uVar14 = 0;
      do {
        pOVar20 = this->m_sn_block0;
        if (pOVar20->m_count == 0) break;
        pOVar3 = this->m_snblk_list[uVar14];
        if (pOVar20->m_sn0 <= pOVar3->m_sn1) {
          if (uVar14 < uVar27 - 1) {
            uVar27 = this->m_snblk_list[uVar14 + 1]->m_sn0;
          }
          else {
            uVar27 = pOVar20->m_sn1 + 1;
          }
          if (pOVar3->m_count == 0) {
            uVar28 = 0;
            uVar22 = 0;
            uVar26 = 0;
          }
          else {
            uVar26 = 0;
            uVar22 = 0;
            uVar23 = 0;
            do {
              uVar28 = (uint)uVar23;
              pOVar20 = this->m_sn_block0;
              if (pOVar20->m_count <= uVar22) break;
              uVar4 = pOVar20->m_sn[uVar22].m_sn;
              if (pOVar3->m_sn[uVar23].m_sn < uVar4) {
                pSVar19 = pOVar3->m_sn + uVar23;
                uVar23 = (ulong)(uVar28 + 1);
              }
              else {
                if (uVar27 <= uVar4) {
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_lookup.cpp"
                             ,0x61b,"","Bogus information - should never get here");
                  break;
                }
                pSVar19 = pOVar20->m_sn + uVar22;
                uVar22 = uVar22 + 1;
              }
              pOVar15->m_sn[uVar26].m_sn = (ON__UINT64)(pSVar19->m_value).m_u;
              uVar8._0_4_ = (pSVar19->m_id).Data1;
              uVar8._4_2_ = (pSVar19->m_id).Data2;
              uVar8._6_2_ = (pSVar19->m_id).Data3;
              pSVar5 = *(SN_ELEMENT **)(pSVar19->m_id).Data4;
              uVar11 = *(undefined4 *)&pSVar19->m_sn;
              uVar12 = *(undefined4 *)((long)&pSVar19->m_sn + 4);
              aVar6 = *(anon_union_8_5_72d3814f_for_m_u *)&pSVar19->m_sn_active;
              uVar7 = *(undefined8 *)&pSVar19->m_value;
              *(SN_ELEMENT **)&pOVar15->m_sn[uVar26].m_id = pSVar19->m_next;
              *(undefined8 *)pOVar15->m_sn[uVar26].m_id.Data4 = uVar7;
              pMVar1 = &pOVar15->m_sn[uVar26 - 1].m_value;
              pMVar1->m_u_type = uVar11;
              pMVar1->m_u32 = uVar12;
              pMVar1->m_u = aVar6;
              pSVar19 = pOVar15->m_sn + (uVar26 - 1);
              pSVar19->m_sn_active = (char)(undefined4)uVar8;
              pSVar19->m_id_active = (char)((ulong)uVar8 >> 8);
              pSVar19->m_reserved1 = (char)((ulong)uVar8 >> 0x10);
              pSVar19->m_reserved2 = (char)((ulong)uVar8 >> 0x18);
              pSVar19->m_id_crc32 = (int)((ulong)uVar8 >> 0x20);
              *(SN_ELEMENT **)(&pSVar19->m_sn_active + 8) = pSVar5;
              uVar26 = (ulong)((int)uVar26 + 1);
              uVar28 = (uint)uVar23;
            } while (uVar28 < pOVar3->m_count);
          }
          uVar24 = pOVar3->m_count - uVar28;
          if (uVar24 == 0) {
            pOVar20 = this->m_sn_block0;
            if (uVar22 < pOVar20->m_count) {
              lVar16 = (ulong)uVar22 * 0x38 + 0x30;
              uVar23 = uVar26;
              do {
                uVar26 = uVar23;
                if (uVar27 <= *(ulong *)((long)(&pOVar20->m_sn[0].m_id + -2) + lVar16)) break;
                puVar21 = (undefined8 *)((long)(&pOVar20->m_sn[0].m_id + -2) + lVar16);
                uVar22 = uVar22 + 1;
                uVar26 = (ulong)((int)uVar23 + 1);
                pOVar15->m_sn[uVar23].m_sn = puVar21[4];
                uVar8 = puVar21[-2];
                pSVar5 = (SN_ELEMENT *)puVar21[-1];
                uVar7 = *puVar21;
                aVar6 = *(anon_union_8_5_72d3814f_for_m_u *)(puVar21 + 1);
                uVar9 = puVar21[2];
                uVar10 = puVar21[3];
                pSVar19 = pOVar15->m_sn + uVar23;
                (pSVar19->m_id).Data1 = (int)uVar9;
                (pSVar19->m_id).Data2 = (short)((ulong)uVar9 >> 0x20);
                (pSVar19->m_id).Data3 = (short)((ulong)uVar9 >> 0x30);
                *(undefined8 *)(pSVar19->m_id).Data4 = uVar10;
                pMVar1 = &pOVar15->m_sn[uVar23 - 1].m_value;
                pMVar1->m_u_type = (int)uVar7;
                pMVar1->m_u32 = (int)((ulong)uVar7 >> 0x20);
                pMVar1->m_u = aVar6;
                pSVar19 = pOVar15->m_sn + (uVar23 - 1);
                pSVar19->m_sn_active = (char)uVar8;
                pSVar19->m_id_active = (char)((ulong)uVar8 >> 8);
                pSVar19->m_reserved1 = (char)((ulong)uVar8 >> 0x10);
                pSVar19->m_reserved2 = (char)((ulong)uVar8 >> 0x18);
                pSVar19->m_id_crc32 = (int)((ulong)uVar8 >> 0x20);
                *(SN_ELEMENT **)(&pSVar19->m_sn_active + 8) = pSVar5;
                pOVar20 = this->m_sn_block0;
                lVar16 = lVar16 + 0x38;
                uVar23 = uVar26;
              } while (uVar22 < pOVar20->m_count);
            }
          }
          else {
            memcpy(&pOVar15->m_sn[uVar26 - 1].m_sn_active,pOVar3->m_sn + uVar28,(ulong)uVar24 * 0x38
                  );
            uVar26 = (ulong)(uVar24 + (int)uVar26);
          }
          uVar28 = (uint)uVar26;
          uVar27 = 0x2000;
          if (uVar28 < 0x2000) {
            uVar27 = uVar26;
          }
          uVar24 = this->m_sn_block0->m_count;
          uVar13 = uVar24 - uVar22;
          if (uVar22 <= uVar24 && uVar13 != 0) {
            memcpy(&pOVar15->m_sn[uVar26 - 1].m_sn_active,this->m_sn_block0->m_sn + uVar22,
                   (ulong)uVar13 * 0x38);
            uVar28 = (uVar28 - uVar22) + this->m_sn_block0->m_count;
          }
          uVar22 = (uint)uVar27;
          pOVar3->m_count = uVar22;
          memcpy(pOVar3->m_sn,pOVar15,uVar27 * 0x38);
          pOVar3->m_sn0 = pOVar3->m_sn[0].m_sn;
          pOVar3->m_sn1 = pOVar3->m_sn[uVar22 - 1].m_sn;
          uVar24 = uVar28 - uVar22;
          if (uVar28 < uVar22 || uVar24 == 0) {
            pOVar20 = this->m_sn_block0;
            pOVar20->m_count = 0;
            pOVar20->m_purged = 0;
            pOVar20->m_sorted = 1;
            pOVar20->m_sn0 = 0;
            pOVar20->m_sn1 = 0;
          }
          else {
            pOVar20 = this->m_sn_block0;
            pOVar20->m_count = uVar24;
            memcpy(pOVar20->m_sn,&pOVar15->m_sn[uVar27 - 1].m_sn_active,(ulong)uVar24 * 0x38);
            pOVar20 = this->m_sn_block0;
            pOVar20->m_sn0 = pOVar20->m_sn[0].m_sn;
            pOVar20->m_sn1 = pOVar20->m_sn[pOVar20->m_count - 1].m_sn;
          }
        }
        uVar14 = uVar14 + 1;
        uVar27 = this->m_snblk_list_count;
      } while (uVar14 < uVar27);
    }
    onfree(pOVar15);
  }
  if (this->m_snblk_list_count != 0) {
    uVar27 = 0;
    do {
      uVar26 = uVar27 + 1;
      uVar14 = uVar26;
      if (uVar26 < this->m_snblk_list_count) {
        do {
          pOVar20 = this->m_snblk_list[uVar27];
          if (0x1fff < pOVar20->m_count) break;
          GarbageCollectMoveHelper((ON_SerialNumberMap *)pOVar15,pOVar20,this->m_snblk_list[uVar14])
          ;
          uVar14 = uVar14 + 1;
        } while (uVar14 < this->m_snblk_list_count);
      }
      uVar27 = uVar26;
    } while (uVar26 < this->m_snblk_list_count);
  }
  OVar25 = this->m_snblk_list_count;
  bVar29 = OVar25 == 0;
  if ((!bVar29) && (this->m_snblk_list[OVar25 - 1]->m_count == 0)) {
    do {
      OVar17 = OVar25;
      bVar29 = OVar17 == 1;
      if (bVar29) {
        OVar25 = 0;
        break;
      }
      pOVar15 = this->m_snblk_list[OVar17 - 2];
      OVar25 = OVar17 - 1;
    } while (pOVar15->m_count == 0);
    this->m_snblk_list_count = OVar17 - 1;
  }
  if (0x800 < this->m_sn_block0->m_count) {
    if (!bVar29) {
      GarbageCollectMoveHelper
                ((ON_SerialNumberMap *)pOVar15,this->m_snblk_list[OVar25 - 1],this->m_sn_block0);
    }
    if (0x1000 < this->m_sn_block0->m_count) {
      uVar27 = this->m_snblk_list_capacity;
      if (this->m_snblk_list_count == uVar27) {
        this->m_snblk_list_capacity = uVar27 + 0x20;
        sz = uVar27 * 8 + 0x100;
        if (this->m_snblk_list == (ON_SN_BLOCK **)0x0) {
          ppOVar18 = (ON_SN_BLOCK **)onmalloc(sz);
        }
        else {
          ppOVar18 = (ON_SN_BLOCK **)onrealloc(this->m_snblk_list,sz);
        }
        this->m_snblk_list = ppOVar18;
        uVar14 = this->m_snblk_list_capacity;
        if (uVar27 < uVar14) {
          do {
            this->m_snblk_list[uVar27] = (ON_SN_BLOCK *)0x0;
            uVar27 = uVar27 + 1;
          } while (uVar14 != uVar27);
        }
      }
      if (this->m_snblk_list[this->m_snblk_list_count] == (ON_SN_BLOCK *)0x0) {
        pOVar15 = (ON_SN_BLOCK *)onmalloc(0x70020);
        this->m_snblk_list[this->m_snblk_list_count] = pOVar15;
      }
      OVar25 = this->m_snblk_list_count;
      this->m_snblk_list_count = OVar25 + 1;
      memcpy(this->m_snblk_list[OVar25],this->m_sn_block0,0x70020);
      pOVar15 = this->m_sn_block0;
      pOVar15->m_count = 0;
      pOVar15->m_purged = 0;
      pOVar15->m_sorted = 1;
      pOVar15->m_sn0 = 0;
      pOVar15->m_sn1 = 0;
    }
  }
  return;
}

Assistant:

void ON_SerialNumberMap::GarbageCollectHelper()
{
  ON__UINT64 i,m;
  ON__UINT32 j,k,n;

  // This is a helper function.  The caller
  // should check that ON_SN_BLOCK::SN_BLOCK_CAPACITY == m_sn_block0.m_count
  // before calling it.

  // memory location for specific elements will be changed.
  // This will make the hash table invalid.
  Internal_HashTableInvalidate();

  if ( m_sn_block0.m_purged > 0 )
  {
    m_sn_count -= m_sn_block0.m_purged;
    m_sn_purged -= m_sn_block0.m_purged;
    m_sn_block0.CullBlockHelper();
    if ( !m_sn_block0.m_sorted )
      m_sn_block0.SortBlockHelper();
    if ( 0 == m_snblk_list_count )
      m_private->SetMaxSn(m_sn_block0.m_sn1);
    if ( m_sn_block0.m_count < 7*(ON_SN_BLOCK::SN_BLOCK_CAPACITY/8) )
      return;
  }
  else if ( !m_sn_block0.m_sorted )
  {
    m_sn_block0.SortBlockHelper();
    if ( 0 == m_snblk_list_count )
      m_private->SetMaxSn(m_sn_block0.m_sn1);
  }

  // Remove all purged serial numbers from every block
  // and make sure every block is sorted.
  m_sn_purged = 0;
  m_sn_count = m_sn_block0.m_count;
  i = m_snblk_list_count;
  while (i--)
  {
    if ( m_snblk_list[i]->m_purged > 0 )
    {
      // The next call may empty m_snblk_list[i].
      m_snblk_list[i]->CullBlockHelper();
    }
    m_sn_count += m_snblk_list[i]->m_count;
  }

  // Put empty blocks at the end of the list
  for ( i = 0; i < m_snblk_list_count; i++ )
  {
    if ( 0 == m_snblk_list[i]->m_count )
    {
      // m_snblk_list[i] is empty ...
      for(m = i+1; m < m_snblk_list_count; m++ )
      {
        if ( m_snblk_list[m]->m_count > 0 )
        {
          // ... and m_snblk_list[m] is not empty
          ON_qsort(m_snblk_list+i,(size_t)(m_snblk_list_count-i),sizeof(*m_snblk_list),ON_SN_BLOCK::CompareMaxSN);
          break;
        }
      }
      while ( m_snblk_list_count > 0 && 0 == m_snblk_list[m_snblk_list_count-1]->m_count )
        m_snblk_list_count--;
      break;
    }
  }

  if (    m_snblk_list_count > 0 
       && m_snblk_list[m_snblk_list_count-1]->m_sn1 > m_sn_block0.m_sn0 
     )
  {
    // Merge the serial number lists so the blocks in m_sn_list[]
    // have the lowest serial numbers and m_sn_block0.m_sn[] contains
    // the largest.
    ON__UINT32 snarray_count = 0;
    struct SN_ELEMENT* snarray = (struct SN_ELEMENT*)onmalloc(2*ON_SN_BLOCK::SN_BLOCK_CAPACITY*sizeof(snarray[0]));
    for ( i = 0; i < m_snblk_list_count && m_sn_block0.m_count > 0; i++ )
    {
      if ( m_snblk_list[i]->m_sn1 < m_sn_block0.m_sn0 )
        continue;

      // Move some entries in m_sn_block0.m_sn[] 
      // to m_snblk_list[i]->m_sn[].
      ON_SN_BLOCK* blk = m_snblk_list[i];
      const ON__UINT64 sn1 = (i < m_snblk_list_count-1) 
                             ? m_snblk_list[i+1]->m_sn0 
                             : (m_sn_block0.m_sn1+1);
      snarray_count = j = k = 0;
      while(j < blk->m_count && k < m_sn_block0.m_count )
      {
        if ( blk->m_sn[j].m_sn < m_sn_block0.m_sn[k].m_sn )
        {
          snarray[snarray_count++] = blk->m_sn[j++];
        }
        else if ( m_sn_block0.m_sn[k].m_sn < sn1 )
        {
          snarray[snarray_count++] = m_sn_block0.m_sn[k++];
        }
        else
        {
          // If m_sn_block0.m_sn[m_sn_block0.m_count-1].m_sn is the largest
          // value, then we should get j == blk->m_count exit.
          // If blk->m_sn[blk->m_count-1].m_sn is the largest value,
          // then we should get k == m_sn_block0.m_count and exit.
          ON_ERROR("Bogus information - should never get here");
          break;
        }
      }
      n = blk->m_count-j;
      if ( n > 0 )
      {
        memcpy(&snarray[snarray_count],&blk->m_sn[j],(size_t)(n*sizeof(snarray[0])));
        snarray_count += n;
      }
      else
      {
        while ( k < m_sn_block0.m_count && m_sn_block0.m_sn[k].m_sn < sn1 )
          snarray[snarray_count++] = m_sn_block0.m_sn[k++];
      }
      n = (snarray_count > ON_SN_BLOCK::SN_BLOCK_CAPACITY) 
        ? ON_SN_BLOCK::SN_BLOCK_CAPACITY 
        : snarray_count;
      if ( k < m_sn_block0.m_count )
      {
        memcpy(&snarray[snarray_count],
               &m_sn_block0.m_sn[k],
               (size_t)((m_sn_block0.m_count-k)*sizeof(snarray[0]))
               );
        snarray_count += (m_sn_block0.m_count-k);
      }
      blk->m_count = n;
      memcpy(&blk->m_sn[0],snarray,(size_t)(blk->m_count*sizeof(blk->m_sn[0])));
      blk->m_sn0 = blk->m_sn[0].m_sn;
      blk->m_sn1 = blk->m_sn[blk->m_count-1].m_sn;
      if ( snarray_count > n )
      {
        // put the end of snarray[] (the largest serial numbers)
        // in m_sn_block0.m_sn[].
        m_sn_block0.m_count = (snarray_count-n);
        memcpy(&m_sn_block0.m_sn[0],
               &snarray[n],
               (size_t)(m_sn_block0.m_count*sizeof(m_sn_block0.m_sn[0]))
               );
        m_sn_block0.m_sn0 = m_sn_block0.m_sn[0].m_sn;
        m_sn_block0.m_sn1 = m_sn_block0.m_sn[m_sn_block0.m_count-1].m_sn;
      }
      else
      {
        m_sn_block0.EmptyBlock();
      }
    }
    onfree(snarray);
    snarray = 0;
  }

  // Compact the blocks in m_sn_list[]
  for ( i = 0; i < m_snblk_list_count; i++ )
  {
    for ( m = i+1; m < m_snblk_list_count; m++ )
    {
      if ( m_snblk_list[i]->m_count >= ON_SN_BLOCK::SN_BLOCK_CAPACITY )
        break;
      GarbageCollectMoveHelper(m_snblk_list[i],m_snblk_list[m]);
    }
  }
  while ( m_snblk_list_count > 0 && 0 == m_snblk_list[m_snblk_list_count-1]->m_count )
  {
    m_snblk_list_count--;
  }

  // Make sure m_sn_block0.m_an[] is has plenty of room
  if ( m_sn_block0.m_count > ON_SN_BLOCK::SN_BLOCK_CAPACITY/4 )
  {
    if ( m_snblk_list_count > 0 )
    {
      GarbageCollectMoveHelper(m_snblk_list[m_snblk_list_count-1],&m_sn_block0);
    }
    if ( m_sn_block0.m_count > ON_SN_BLOCK::SN_BLOCK_CAPACITY/2 )
    {
      // Need to add a new block to m_snblk_list[]
      if ( m_snblk_list_count == m_snblk_list_capacity )
      {
        // Add room to store more pointers to blocks in the m_sn_list[]
        i = m_snblk_list_capacity;
        m_snblk_list_capacity += 32;
        m = m_snblk_list_capacity*sizeof(m_snblk_list[0]);
        m_snblk_list = (ON_SN_BLOCK**)((0 == m_snblk_list)
                     ? onmalloc((size_t)m)
                     : onrealloc(m_snblk_list,(size_t)m));
        while ( i < m_snblk_list_capacity )
          m_snblk_list[i++] = 0;
      }
      if ( 0 == m_snblk_list[m_snblk_list_count] )
      {
        // add room to store at more serial numbers
        m_snblk_list[m_snblk_list_count] = (ON_SN_BLOCK*)onmalloc(sizeof(*(m_snblk_list[m_snblk_list_count])));
      }
      *m_snblk_list[m_snblk_list_count++] = m_sn_block0;
      m_sn_block0.EmptyBlock();
    }
  }
}